

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBase.cpp
# Opt level: O2

ostream * jbcoin::operator<<(ostream *out,STBase *t)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*t->_vptr_STBase[5])(local_30);
  poVar1 = std::operator<<(out,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& out, const STBase& t)
{
    return out << t.getFullText ();
}